

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LifeFormAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::LifeFormAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LifeFormAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KINT32 Value_03;
  KINT32 Value_04;
  KINT32 Value_05;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  LifeFormAppearance *local_18;
  LifeFormAppearance *this_local;
  
  local_18 = this;
  this_local = (LifeFormAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Lifeform Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tPaint Scheme:         ");
  ENUMS::GetEnumAsStringEntityPaintScheme_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tDamage:               ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tCompliance:           ");
  ENUMS::GetEnumAsStringEntityCompliance_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)((uint)*this >> 5 & 0xf),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n\tSignal Smoke In Use:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xb & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFlash Lights:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xc & 1);
  poVar1 = std::operator<<(poVar1,"\n\tSignal Mirror In Use: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xd & 1);
  poVar1 = std::operator<<(poVar1,"\n\tIR Strobe On:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xe & 1);
  poVar1 = std::operator<<(poVar1,"\n\tIR Illuminator On:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xf & 1);
  poVar1 = std::operator<<(poVar1,"\n\tLifeform State:       ");
  ENUMS::GetEnumAsStringEntityLifeformAppearance_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)(*(ushort *)&this->field_0x2 & 0xf),Value_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tMounted/Hoisted:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x16 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tWeapon 1:             ");
  ENUMS::GetEnumAsStringEntityLifeformWeapon_abi_cxx11_
            (&local_250,(ENUMS *)(ulong)((byte)this->field_0x3 & 3),Value_03);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"\n\tWeapon 2:             ");
  ENUMS::GetEnumAsStringEntityLifeformWeapon_abi_cxx11_
            (&local_270,(ENUMS *)(ulong)((uint)*this >> 0x1a & 3),Value_04);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"\n\tCamouflage:           ");
  ENUMS::GetEnumAsStringEntityCamouflage_abi_cxx11_
            (&local_290,(ENUMS *)(ulong)((uint)*this >> 0x1c & 3),Value_05);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,"\n\tConcealed Stationary: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1e & 1);
  poVar1 = std::operator<<(poVar1,"\n\tConcealed Movement:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x1f);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LifeFormAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Lifeform Appearance:"
       << "\n\tPaint Scheme:         " << GetEnumAsStringEntityPaintScheme( m_PaintScheme )
       << "\n\tDamage:               " << GetEnumAsStringEntityDamage( m_Damage )
       << "\n\tCompliance:           " << GetEnumAsStringEntityCompliance( m_Compliance )
       << "\n\tSignal Smoke In Use:  " << m_SignalSmokeInUse
       << "\n\tFlash Lights:         " << m_Flashlight
       << "\n\tSignal Mirror In Use: " << m_SignalMirrorInUse
       << "\n\tIR Strobe On:         " << m_IRStrobe
       << "\n\tIR Illuminator On:    " << m_IRIlluminator
       << "\n\tLifeform State:       " << GetEnumAsStringEntityLifeformAppearance( m_LifeformState )
       << "\n\tFrozen Status:        " << m_FrozenStatus
       << "\n\tMounted/Hoisted:      " << m_MountedHoisted
       << "\n\tState:                " << m_State
       << "\n\tWeapon 1:             " << GetEnumAsStringEntityLifeformWeapon( m_Weapon1 )
       << "\n\tWeapon 2:             " << GetEnumAsStringEntityLifeformWeapon( m_Weapon2 )
       << "\n\tCamouflage:           " << GetEnumAsStringEntityCamouflage( m_Camouflage )
       << "\n\tConcealed Stationary: " << m_ConcealedStationary
       << "\n\tConcealed Movement:   " << m_ConcealedMovement
       << "\n";

    return ss.str();
}